

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

float MARGINAL::get_adanormalhedge_weights(float R,float C)

{
  float fVar1;
  
  fVar1 = 0.0;
  if ((C != 0.0) || (NAN(C))) {
    if (R <= 0.0) {
      R = 0.0;
    }
    if ((R != 0.0) || (NAN(R))) {
      fVar1 = expf((R * R) / (C * 3.0));
      fVar1 = (fVar1 * (R + R)) / (C * 3.0);
    }
  }
  return fVar1;
}

Assistant:

float get_adanormalhedge_weights(float R, float C)
{
  float Rpos = R > 0 ? R : 0.f;
  if (C == 0. || Rpos == 0.)
    return 0;
  return 2 * Rpos * correctedExp(Rpos * Rpos / (3 * C)) / (3 * C);
}